

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> * __thiscall
docopt::BranchPattern::flat
          (vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *__return_storage_ptr__,
          BranchPattern *this,_func_bool_Pattern_ptr *filter)

{
  initializer_list<docopt::Pattern_*> __l;
  bool bVar1;
  element_type *peVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
  local_98;
  const_iterator local_90;
  undefined1 local_88 [8];
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> sublist;
  shared_ptr<docopt::Pattern> *child;
  iterator __end2;
  iterator __begin2;
  PatternList *__range2;
  allocator<docopt::Pattern_*> local_39;
  BranchPattern *local_38;
  BranchPattern **local_30;
  size_type local_28;
  _func_bool_Pattern_ptr *local_20;
  _func_bool_Pattern_ptr *filter_local;
  BranchPattern *this_local;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *ret;
  
  local_20 = filter;
  filter_local = (_func_bool_Pattern_ptr *)this;
  this_local = (BranchPattern *)__return_storage_ptr__;
  bVar1 = (*filter)(&this->super_Pattern);
  if (bVar1) {
    local_30 = &local_38;
    local_28 = 1;
    local_38 = this;
    std::allocator<docopt::Pattern_*>::allocator(&local_39);
    __l._M_len = local_28;
    __l._M_array = (iterator)local_30;
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              (__return_storage_ptr__,__l,&local_39);
    std::allocator<docopt::Pattern_*>::~allocator(&local_39);
  }
  else {
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              (__return_storage_ptr__);
    __end2 = std::
             vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::begin(&this->fChildren);
    child = (shared_ptr<docopt::Pattern> *)
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::end(&this->fChildren);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                       *)&child), bVar1) {
      sublist.super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                    ::operator*(&__end2);
      peVar2 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)sublist.
                             super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (**peVar2->_vptr_Pattern)(local_88,peVar2,local_20);
      local_98._M_current =
           (Pattern **)
           std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<docopt::Pattern*const*,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>
      ::__normal_iterator<docopt::Pattern**>
                ((__normal_iterator<docopt::Pattern*const*,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>
                  *)&local_90,&local_98);
      __first = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::begin
                          ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_88
                          );
      __last = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                         ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_88)
      ;
      std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>::
      insert<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,void>
                ((vector<docopt::Pattern*,std::allocator<docopt::Pattern*>> *)__return_storage_ptr__
                 ,local_90,
                 (__normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  )__last._M_current);
      std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~vector
                ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_88);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Pattern*> flat(bool (*filter)(Pattern const*)) override {
			if (filter(this)) {
				return {this};
			}

			std::vector<Pattern*> ret;
			for(auto& child : fChildren) {
				auto sublist = child->flat(filter);
				ret.insert(ret.end(), sublist.begin(), sublist.end());
			}
			return ret;
		}